

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::cbor::basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_>::
read_tags(basic_cbor_parser<jsoncons::stream_source<unsigned_char>,_std::allocator<char>_> *this,
         error_code *ec)

{
  ulong uVar1;
  char_result<unsigned_char> cVar2;
  uint64_t uVar3;
  
  while( true ) {
    cVar2 = stream_source<unsigned_char>::peek(&this->source_);
    if (((ushort)cVar2 >> 8 & 1) != 0) {
      std::error_code::operator=(ec,unexpected_eof);
      this->more_ = false;
      return;
    }
    if (((ushort)cVar2 & 0xe0) != 0xc0) break;
    uVar3 = get_uint64_value(this,ec);
    if (ec->_M_value != 0) {
      return;
    }
    uVar1 = (this->other_tags_).super__Base_bitset<1UL>._M_w;
    if (uVar3 == 0x100) {
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar1 | 2;
    }
    else if (uVar3 == 0x19) {
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar1 | 1;
    }
    else {
      (this->other_tags_).super__Base_bitset<1UL>._M_w = uVar1 | 4;
      this->raw_tag_ = uVar3;
    }
  }
  return;
}

Assistant:

void read_tags(std::error_code& ec)
    {
        auto c = source_.peek();
        if (JSONCONS_UNLIKELY(c.eof))
        {
            ec = cbor_errc::unexpected_eof;
            more_ = false;
            return;
        }
        jsoncons::cbor::detail::cbor_major_type major_type = get_major_type(c.value);

        while (major_type == jsoncons::cbor::detail::cbor_major_type::semantic_tag)
        {
            uint64_t val = get_uint64_value(ec);
            if (JSONCONS_UNLIKELY(ec))
            {
                return;
            }
            switch(val)
            {
                case 25: // stringref
                    other_tags_[stringref_tag] = true;
                    break;
                case 256: // stringref-namespace
                    other_tags_[stringref_namespace_tag] = true;
                    break;
                default:
                    other_tags_[item_tag] = true;
                    raw_tag_ = val;
                    break;
            }
            c = source_.peek();
            if (JSONCONS_UNLIKELY(c.eof))
            {
                ec = cbor_errc::unexpected_eof;
                more_ = false;
                return;
            }
            major_type = get_major_type(c.value);
        }
    }